

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void CalcWindowContentSizes
               (ImGuiWindow_conflict *window,ImVec2 *content_size_current,ImVec2 *content_size_ideal
               )

{
  float fVar1;
  uint uVar2;
  float fVar3;
  
  if ((((window->Collapsed != true) || ('\0' < window->AutoFitFramesX)) ||
      ('\0' < window->AutoFitFramesY)) &&
     (((window->Hidden != true || (window->HiddenFramesCannotSkipItems != '\0')) ||
      (window->HiddenFramesCanSkipItems < '\x01')))) {
    fVar3 = (window->ContentSizeExplicit).x;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      fVar3 = (float)(int)((window->DC).CursorMaxPos.x - (window->DC).CursorStartPos.x);
    }
    content_size_current->x = fVar3;
    fVar3 = (window->ContentSizeExplicit).y;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      fVar3 = (float)(int)((window->DC).CursorMaxPos.y - (window->DC).CursorStartPos.y);
    }
    content_size_current->y = fVar3;
    fVar3 = (window->ContentSizeExplicit).x;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      fVar3 = (window->DC).CursorMaxPos.x;
      fVar1 = (window->DC).IdealMaxPos.x;
      uVar2 = -(uint)(fVar1 <= fVar3);
      fVar3 = (float)(int)((float)(~uVar2 & (uint)fVar1 | (uint)fVar3 & uVar2) -
                          (window->DC).CursorStartPos.x);
    }
    content_size_ideal->x = fVar3;
    fVar3 = (window->ContentSizeExplicit).y;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      fVar3 = (window->DC).CursorMaxPos.y;
      fVar1 = (window->DC).IdealMaxPos.y;
      uVar2 = -(uint)(fVar1 <= fVar3);
      fVar3 = (float)(int)((float)(~uVar2 & (uint)fVar1 | (uint)fVar3 & uVar2) -
                          (window->DC).CursorStartPos.y);
    }
    content_size_ideal->y = fVar3;
    return;
  }
  *content_size_current = window->ContentSize;
  *content_size_ideal = window->ContentSizeIdeal;
  return;
}

Assistant:

static void CalcWindowContentSizes(ImGuiWindow* window, ImVec2* content_size_current, ImVec2* content_size_ideal)
{
    bool preserve_old_content_sizes = false;
    if (window->Collapsed && window->AutoFitFramesX <= 0 && window->AutoFitFramesY <= 0)
        preserve_old_content_sizes = true;
    else if (window->Hidden && window->HiddenFramesCannotSkipItems == 0 && window->HiddenFramesCanSkipItems > 0)
        preserve_old_content_sizes = true;
    if (preserve_old_content_sizes)
    {
        *content_size_current = window->ContentSize;
        *content_size_ideal = window->ContentSizeIdeal;
        return;
    }

    content_size_current->x = (window->ContentSizeExplicit.x != 0.0f) ? window->ContentSizeExplicit.x : IM_FLOOR(window->DC.CursorMaxPos.x - window->DC.CursorStartPos.x);
    content_size_current->y = (window->ContentSizeExplicit.y != 0.0f) ? window->ContentSizeExplicit.y : IM_FLOOR(window->DC.CursorMaxPos.y - window->DC.CursorStartPos.y);
    content_size_ideal->x = (window->ContentSizeExplicit.x != 0.0f) ? window->ContentSizeExplicit.x : IM_FLOOR(ImMax(window->DC.CursorMaxPos.x, window->DC.IdealMaxPos.x) - window->DC.CursorStartPos.x);
    content_size_ideal->y = (window->ContentSizeExplicit.y != 0.0f) ? window->ContentSizeExplicit.y : IM_FLOOR(ImMax(window->DC.CursorMaxPos.y, window->DC.IdealMaxPos.y) - window->DC.CursorStartPos.y);
}